

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void countFinalize(sqlite3_context *context)

{
  Mem *p;
  i64 iVar1;
  
  p = context->pMem;
  if ((p->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(p);
    p->flags = 1;
    p->z = (char *)0x0;
  }
  else if ((i64 *)p->z != (i64 *)0x0) {
    iVar1 = *(i64 *)p->z;
    goto LAB_001a250a;
  }
  iVar1 = 0;
LAB_001a250a:
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u.i = iVar1;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void countFinalize(sqlite3_context *context){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  sqlite3_result_int64(context, p ? p->n : 0);
}